

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aa_warmup.c
# Opt level: O0

int test(LIBSSH2_SESSION *session)

{
  undefined8 uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  char *hostkey;
  undefined8 uStack_18;
  int type;
  size_t len;
  LIBSSH2_SESSION *session_local;
  
  uStack_18 = 0;
  hostkey._4_4_ = 0;
  len = (size_t)session;
  uVar1 = libssh2_session_hostkey(session,&stack0xffffffffffffffe8,(long)&hostkey + 4);
  fprintf(_stdout,"libssh2_session_hostkey returned len, type: %ld, %d\n",uStack_18,
          (ulong)hostkey._4_4_,in_R8,in_R9,uVar1);
  return 0;
}

Assistant:

int test(LIBSSH2_SESSION *session)
{
    size_t len = 0;
    int type = 0;
    const char *hostkey = libssh2_session_hostkey(session, &len, &type);

    (void)hostkey;

    fprintf(stdout,
            "libssh2_session_hostkey returned len, type: %ld, %d\n",
            (long)len, type);

    return 0;  /* always return success */
}